

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unqlite_kv_cursor_data(unqlite_kv_cursor *pCursor,void *pBuf,unqlite_int64 *pnByte)

{
  int iVar1;
  SyBlob sBlob;
  
  if (pBuf != (void *)0x0) {
    if (*pnByte < 0) {
      iVar1 = -0x18;
    }
    else {
      sBlob.mByte = (sxu32)*pnByte;
      sBlob.nByte = 0;
      sBlob.pAllocator = (SyMemBackend *)0x0;
      sBlob.nFlags = 3;
      sBlob.pBlob = pBuf;
      iVar1 = (*pCursor->pStore->pIo->pMethods->xData)(pCursor,unqliteDataConsumer,&sBlob);
      *pnByte = (ulong)sBlob.nByte;
      SyBlobRelease(&sBlob);
    }
    return iVar1;
  }
  iVar1 = (*pCursor->pStore->pIo->pMethods->xDataLength)(pCursor,pnByte);
  return iVar1;
}

Assistant:

int unqlite_kv_cursor_data(unqlite_kv_cursor *pCursor,void *pBuf,unqlite_int64 *pnByte)
{
	int rc;
#ifdef UNTRUST
	if( pCursor == 0 ){
		return UNQLITE_CORRUPT;
	}
#endif
	if( pBuf == 0 ){
		/* Data length only */
		rc = pCursor->pStore->pIo->pMethods->xDataLength(pCursor,pnByte);
	}else{
		SyBlob sBlob;
		if( (*pnByte) < 0 ){
			return UNQLITE_CORRUPT;
		}
		/* Initialize the data consumer */
		SyBlobInitFromBuf(&sBlob,pBuf,(sxu32)(*pnByte));
		/* Consume the data */
		rc = pCursor->pStore->pIo->pMethods->xData(pCursor,unqliteDataConsumer,&sBlob);
		/* Data length */
		*pnByte = SyBlobLength(&sBlob);
		/* Cleanup */
		SyBlobRelease(&sBlob);
	}
	return rc;
}